

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

char * anon_unknown.dwarf_426d84::parse_discriminator(char *first,char *last)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char *local_28;
  char *t1_1;
  char *t1;
  char *last_local;
  char *first_local;
  
  last_local = first;
  if (first != last) {
    if (*first == '_') {
      pcVar2 = first + 1;
      if (pcVar2 != last) {
        iVar1 = isdigit((int)*pcVar2);
        if (iVar1 == 0) {
          if (*pcVar2 == '_') {
            t1_1 = first + 2;
            while( true ) {
              bVar3 = false;
              if (t1_1 != last) {
                iVar1 = isdigit((int)*t1_1);
                bVar3 = iVar1 != 0;
              }
              if (!bVar3) break;
              t1_1 = t1_1 + 1;
            }
            if ((t1_1 != last) && (*t1_1 == '_')) {
              last_local = t1_1 + 1;
            }
          }
        }
        else {
          last_local = first + 2;
        }
      }
    }
    else {
      iVar1 = isdigit((int)*first);
      if (iVar1 != 0) {
        local_28 = first + 1;
        while( true ) {
          bVar3 = false;
          if (local_28 != last) {
            iVar1 = isdigit((int)*local_28);
            bVar3 = iVar1 != 0;
          }
          if (!bVar3) break;
          local_28 = local_28 + 1;
        }
        if (local_28 == last) {
          last_local = last;
        }
      }
    }
  }
  return last_local;
}

Assistant:

const char*
parse_discriminator(const char* first, const char* last)
{
    // parse but ignore discriminator
    if (first != last)
    {
        if (*first == '_')
        {
            const char* t1 = first+1;
            if (t1 != last)
            {
                if (std::isdigit(*t1))
                    first = t1+1;
                else if (*t1 == '_')
                {
                    for (++t1; t1 != last && std::isdigit(*t1); ++t1)
                        ;
                    if (t1 != last && *t1 == '_')
                        first = t1 + 1;
                }
            }
        }
        else if (std::isdigit(*first))
        {
            const char* t1 = first+1;
            for (; t1 != last && std::isdigit(*t1); ++t1)
                ;
            if (t1 == last)
                first = last;
        }
    }
    return first;
}